

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O3

int worker_is_idle(worker_handle *wh)

{
  mutex_handle *mutex;
  uint uVar1;
  void *pvVar2;
  
  pvVar2 = wh->priv;
  mutex = (mutex_handle *)((long)pvVar2 + 0x10);
  mutex_lock_shared(mutex);
  uVar1 = *(uint *)((long)pvVar2 + 0x38);
  mutex_unlock_shared(mutex);
  return (int)(4 < uVar1);
}

Assistant:

int worker_is_idle(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;
	int ret = 0;

	mutex_lock_shared(&priv->mutex);

	if (priv->state >= WORKER_IDLE)
		ret = 1;

	mutex_unlock_shared(&priv->mutex);

	return ret;
}